

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
* __thiscall
MutableS2ShapeIndex::ReleaseAll
          (vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
           *__return_storage_ptr__,MutableS2ShapeIndex *this)

{
  bool bVar1;
  S2ShapeIndexCell *this_00;
  ostream *poVar2;
  S2LogMessage local_78;
  S2LogMessageVoidify local_65 [13];
  undefined1 local_58 [8];
  Iterator it;
  MutableS2ShapeIndex *this_local;
  vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  *result;
  
  it.end_._8_8_ = this;
  Iterator::Iterator((Iterator *)local_58);
  Iterator::InitStale((Iterator *)local_58,this,BEGIN);
  while (bVar1 = S2ShapeIndex::IteratorBase::done((IteratorBase *)local_58),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = Iterator::cell((Iterator *)local_58);
    if (this_00 != (S2ShapeIndexCell *)0x0) {
      S2ShapeIndexCell::~S2ShapeIndexCell(this_00);
      operator_delete(this_00);
    }
    Iterator::Next((Iterator *)local_58);
  }
  gtl::internal_btree::
  btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
  ::clear((btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
           *)&this->cell_map_);
  this->pending_additions_begin_ = 0;
  std::
  unique_ptr<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
  ::reset(&this->pending_removals_,(pointer)0x0);
  bVar1 = std::operator==(&this->update_state_,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::atomic<MutableS2ShapeIndex::IndexStatus>::store
              (&this->index_status_,FRESH,memory_order_relaxed);
    std::
    vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
    ::vector(__return_storage_ptr__);
    std::
    vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
    ::swap(__return_storage_ptr__,&this->shapes_);
    Iterator::~Iterator((Iterator *)local_58);
    return __return_storage_ptr__;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
             ,0xe0,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_78);
  poVar2 = std::operator<<(poVar2,"Check failed: update_state_ == nullptr ");
  S2LogMessageVoidify::operator&(local_65,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_78);
}

Assistant:

vector<unique_ptr<S2Shape>> MutableS2ShapeIndex::ReleaseAll() {
  Iterator it;
  for (it.InitStale(this, S2ShapeIndex::BEGIN); !it.done(); it.Next()) {
    delete &it.cell();
  }
  cell_map_.clear();
  pending_additions_begin_ = 0;
  pending_removals_.reset();
  S2_DCHECK(update_state_ == nullptr);
  index_status_.store(FRESH, std::memory_order_relaxed);
  vector<unique_ptr<S2Shape>> result;
  result.swap(shapes_);
  return result;
}